

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::TryIfCharInst::Exec
          (TryIfCharInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  CharCount CVar2;
  Label LVar3;
  char *pcVar4;
  uint8 *puVar5;
  
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  if ((*inputOffset < inputLength) && (input[*inputOffset] == (this->super_CharMixin).c)) {
    pcVar4 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
             Push<UnifiedRegex::ResumeCont>
                       (&contStack->
                         super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    CVar2 = *inputOffset;
    LVar3 = (this->super_TryMixin).failLabel;
    pcVar4[8] = '\0';
    *(undefined ***)pcVar4 = &PTR_Print_013e01e8;
    *(CharCount *)(pcVar4 + 0xc) = CVar2;
    *(Label *)(pcVar4 + 0x10) = LVar3;
    Matcher::PushStats(matcher,contStack,input);
    puVar5 = *instPointer + 7;
  }
  else {
    puVar5 = Matcher::LabelToInstPointer(matcher,(this->super_TryMixin).failLabel);
  }
  *instPointer = puVar5;
  return false;
}

Assistant:

inline bool TryIfCharInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset < inputLength && input[inputOffset] == c)
        {
            // CHOICEPOINT: Resume at fail label on backtrack
            PUSH(contStack, ResumeCont, inputOffset, failLabel);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
            instPointer += sizeof(*this);
            return false;
        }

        // Proceed directly to exit
        instPointer = matcher.LabelToInstPointer(failLabel);
        return false;
    }